

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::IsUSDA(uint8_t *addr,size_t length)

{
  int iVar1;
  undefined8 local_2a;
  char header [10];
  size_t length_local;
  uint8_t *addr_local;
  
  if (length < 9) {
    addr_local._7_1_ = false;
  }
  else {
    local_2a = 0x2e31206164737523;
    header[0] = '0';
    header[1] = '\0';
    header._2_8_ = length;
    iVar1 = memcmp(&local_2a,addr,9);
    if (iVar1 == 0) {
      addr_local._7_1_ = true;
    }
    else {
      addr_local._7_1_ = false;
    }
  }
  return addr_local._7_1_;
}

Assistant:

bool IsUSDA(const uint8_t *addr, const size_t length) {
  if (length < 9) {
    return false;
  }
  const char header[9 + 1] = "#usda 1.0";

  if (memcmp(header, addr, 9) == 0) {
    return true;
  }

  return false;
}